

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

char * parse_value(cJSON *item,char *value,char **ep)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  cJSON *pcVar4;
  cJSON *pcVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (value == (char *)0x0) {
    return (char *)0x0;
  }
  iVar2 = strncmp(value,"null",4);
  if (iVar2 == 0) {
    item->type = 4;
LAB_00106c1b:
    return value + 4;
  }
  iVar2 = strncmp(value,"false",5);
  if (iVar2 == 0) {
    item->type = 1;
    return value + 5;
  }
  iVar2 = strncmp(value,"true",4);
  if (iVar2 == 0) {
    item->type = 2;
    item->valueint = 1;
    goto LAB_00106c1b;
  }
  cVar1 = *value;
  if (cVar1 != '-') {
    if (cVar1 == '\"') {
      pcVar3 = parse_string(item,value,ep);
      return pcVar3;
    }
    if (9 < (byte)(cVar1 - 0x30U)) {
      if (cVar1 == '{') {
        item->type = 0x40;
        pcVar3 = skip(value + 1);
        if (*pcVar3 == '}') goto LAB_00106e98;
        pcVar4 = (cJSON *)(*cJSON_malloc)(0x40);
        if (pcVar4 != (cJSON *)0x0) {
          pcVar4->valuedouble = 0.0;
          pcVar4->string = (char *)0x0;
          pcVar4->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar4->valueint = 0;
          pcVar4->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar4->type = 0;
          pcVar4->next = (cJSON *)0x0;
          pcVar4->prev = (cJSON *)0x0;
          item->child = pcVar4;
          pcVar3 = skip(pcVar3);
          pcVar3 = parse_string(pcVar4,pcVar3,ep);
          pcVar3 = skip(pcVar3);
          if (pcVar3 == (char *)0x0) {
            return (char *)0x0;
          }
          pcVar4->string = pcVar4->valuestring;
          pcVar4->valuestring = (char *)0x0;
          if (*pcVar3 == ':') {
            pcVar3 = skip(pcVar3 + 1);
            pcVar3 = parse_value(pcVar4,pcVar3,ep);
            pcVar3 = skip(pcVar3);
            if (pcVar3 == (char *)0x0) {
              return (char *)0x0;
            }
            while( true ) {
              if (*pcVar3 != ',') {
                if (*pcVar3 != '}') {
                  *ep = pcVar3;
                  return (char *)0x0;
                }
                return pcVar3 + 1;
              }
              pcVar5 = (cJSON *)(*cJSON_malloc)(0x40);
              if (pcVar5 == (cJSON *)0x0) {
                return (char *)0x0;
              }
              pcVar5->valuedouble = 0.0;
              pcVar5->string = (char *)0x0;
              pcVar5->valuestring = (char *)0x0;
              *(undefined8 *)&pcVar5->valueint = 0;
              pcVar5->child = (cJSON *)0x0;
              *(undefined8 *)&pcVar5->type = 0;
              pcVar5->next = (cJSON *)0x0;
              pcVar5->prev = (cJSON *)0x0;
              pcVar4->next = pcVar5;
              pcVar5->prev = pcVar4;
              pcVar3 = skip(pcVar3 + 1);
              pcVar3 = parse_string(pcVar5,pcVar3,ep);
              pcVar3 = skip(pcVar3);
              if (pcVar3 == (char *)0x0) {
                return (char *)0x0;
              }
              pcVar5->string = pcVar5->valuestring;
              pcVar5->valuestring = (char *)0x0;
              if (*pcVar3 != ':') break;
              pcVar3 = skip(pcVar3 + 1);
              pcVar3 = parse_value(pcVar5,pcVar3,ep);
              pcVar3 = skip(pcVar3);
              pcVar4 = pcVar5;
              if (pcVar3 == (char *)0x0) {
                return (char *)0x0;
              }
            }
          }
          *ep = pcVar3;
          return (char *)0x0;
        }
      }
      else {
        if (cVar1 != '[') {
          *ep = value;
          return (char *)0x0;
        }
        item->type = 0x20;
        pcVar3 = skip(value + 1);
        if (*pcVar3 == ']') {
LAB_00106e98:
          return pcVar3 + 1;
        }
        pcVar4 = (cJSON *)(*cJSON_malloc)(0x40);
        if (pcVar4 != (cJSON *)0x0) {
          pcVar4->valuedouble = 0.0;
          pcVar4->string = (char *)0x0;
          pcVar4->valuestring = (char *)0x0;
          *(undefined8 *)&pcVar4->valueint = 0;
          pcVar4->child = (cJSON *)0x0;
          *(undefined8 *)&pcVar4->type = 0;
          pcVar4->next = (cJSON *)0x0;
          pcVar4->prev = (cJSON *)0x0;
          item->child = pcVar4;
          pcVar3 = skip(pcVar3);
          pcVar3 = parse_value(pcVar4,pcVar3,ep);
          pcVar3 = skip(pcVar3);
          if (pcVar3 == (char *)0x0) {
            return (char *)0x0;
          }
          do {
            if (*pcVar3 != ',') {
              if (*pcVar3 != ']') {
                *ep = pcVar3;
                return (char *)0x0;
              }
              return pcVar3 + 1;
            }
            pcVar5 = (cJSON *)(*cJSON_malloc)(0x40);
            if (pcVar5 == (cJSON *)0x0) {
              return (char *)0x0;
            }
            pcVar5->valuedouble = 0.0;
            pcVar5->string = (char *)0x0;
            pcVar5->valuestring = (char *)0x0;
            *(undefined8 *)&pcVar5->valueint = 0;
            pcVar5->child = (cJSON *)0x0;
            *(undefined8 *)&pcVar5->type = 0;
            pcVar5->next = (cJSON *)0x0;
            pcVar5->prev = (cJSON *)0x0;
            pcVar4->next = pcVar5;
            pcVar5->prev = pcVar4;
            pcVar3 = skip(pcVar3 + 1);
            pcVar3 = parse_value(pcVar5,pcVar3,ep);
            pcVar3 = skip(pcVar3);
            pcVar4 = pcVar5;
          } while (pcVar3 != (char *)0x0);
          return (char *)0x0;
        }
      }
      item->child = (cJSON *)0x0;
      return (char *)0x0;
    }
  }
  uVar7 = (ulong)(cVar1 == '-');
  pcVar3 = value + (value[uVar7] == '0') + uVar7;
  bVar6 = value[(value[uVar7] == '0') + uVar7];
  dVar10 = 0.0;
  dVar11 = 0.0;
  if ((byte)(bVar6 - 0x31) < 9) {
    do {
      dVar11 = dVar11 * 10.0 + (double)(int)(bVar6 - 0x30);
      bVar6 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while ((byte)(bVar6 - 0x30) < 10);
  }
  if (bVar6 == 0x2e) {
    bVar6 = pcVar3[1];
    dVar10 = 0.0;
    if ((byte)(bVar6 - 0x30) < 10) {
      pcVar3 = pcVar3 + 1;
      do {
        dVar11 = dVar11 * 10.0 + (double)(int)(bVar6 - 0x30);
        dVar10 = dVar10 + -1.0;
        bVar6 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
      goto LAB_00106cd0;
    }
  }
  else {
LAB_00106cd0:
    if ((bVar6 | 0x20) == 0x65) {
      if (pcVar3[1] == '-') {
        pcVar3 = pcVar3 + 2;
        iVar2 = -1;
      }
      else {
        iVar2 = 1;
        if (pcVar3[1] == '+') {
          pcVar3 = pcVar3 + 2;
        }
        else {
          pcVar3 = pcVar3 + 1;
        }
      }
      iVar8 = 0;
      for (; (byte)(*pcVar3 - 0x30U) < 10; pcVar3 = pcVar3 + 1) {
        iVar8 = (uint)(byte)(*pcVar3 - 0x30U) + iVar8 * 10;
      }
      dVar9 = (double)(iVar8 * iVar2);
      goto LAB_00106e3a;
    }
  }
  dVar9 = 0.0;
LAB_00106e3a:
  if (cVar1 == '-') {
    dVar11 = -dVar11;
  }
  dVar10 = pow(10.0,dVar10 + dVar9);
  item->valuedouble = dVar10 * dVar11;
  item->valueint = (int)(dVar10 * dVar11);
  item->type = 8;
  return pcVar3;
}

Assistant:

static const char *parse_value(cJSON *item,const char *value,const char **ep)
{
	if (!value)						return 0;	/* Fail on null. */
	if (!strncmp(value,"null",4))	{ item->type=cJSON_NULL;  return value+4; }
	if (!strncmp(value,"false",5))	{ item->type=cJSON_False; return value+5; }
	if (!strncmp(value,"true",4))	{ item->type=cJSON_True; item->valueint=1;	return value+4; }
	if (*value=='\"')				{ return parse_string(item,value,ep); }
	if (*value=='-' || (*value>='0' && *value<='9'))	{ return parse_number(item,value); }
	if (*value=='[')				{ return parse_array(item,value,ep); }
	if (*value=='{')				{ return parse_object(item,value,ep); }

	*ep=value;return 0;	/* failure. */
}